

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlen.c
# Opt level: O0

_Bool ptrlen_contains(ptrlen input,char *characters)

{
  char *pcVar1;
  char *pcVar2;
  char *end;
  char *p;
  char *characters_local;
  ptrlen input_local;
  
  end = (char *)input.ptr;
  pcVar1 = end + input.len;
  while( true ) {
    if (pcVar1 <= end) {
      return false;
    }
    pcVar2 = strchr(characters,(int)*end);
    if (pcVar2 != (char *)0x0) break;
    end = end + 1;
  }
  return true;
}

Assistant:

bool ptrlen_contains(ptrlen input, const char *characters)
{
    for (const char *p = input.ptr, *end = p + input.len; p < end; p++)
        if (strchr(characters, *p))
            return true;
    return false;
}